

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFObjectHandle::newReal
          (QPDFObjectHandle *this,double value,int decimal_places,bool trim_trailing_zeroes)

{
  bool in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined4 in_register_00000034;
  QPDFObjectHandle QVar2;
  undefined1 local_49;
  QPDFObject *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  string local_30;
  
  QUtil::double_to_string_abi_cxx11_
            (&local_30,(QUtil *)CONCAT44(in_register_00000034,decimal_places),value,
             (int)CONCAT71(in_register_00000011,trim_trailing_zeroes),in_CL);
  local_48 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFObject,std::allocator<QPDFObject>,QPDF_Real>
            (a_Stack_40,&local_48,(allocator<QPDFObject> *)&local_49,(QPDF_Real *)&local_30);
  _Var1._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX_00;
  }
  (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48;
  (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = a_Stack_40[0]._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newReal(double value, int decimal_places, bool trim_trailing_zeroes)
{
    return {QPDFObject::create<QPDF_Real>(value, decimal_places, trim_trailing_zeroes)};
}